

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

bool __thiscall
perfetto::protos::gen::TracingServiceState::ParseFromArray
          (TracingServiceState *this,void *raw,size_t size)

{
  byte bVar1;
  pointer pTVar2;
  pointer pTVar3;
  pointer pTVar4;
  pointer pTVar5;
  pointer pTVar6;
  pointer pTVar7;
  uint uVar8;
  undefined1 uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  uint *extraout_RDX_01;
  uint *puVar14;
  bool bVar15;
  uint *puVar16;
  ulong uVar17;
  uint *puVar18;
  uint uVar19;
  uint *puVar20;
  uint *puVar21;
  pointer pTVar22;
  pointer pTVar23;
  pointer pTVar24;
  uint *puVar25;
  uint *puVar26;
  bool bVar27;
  uint *local_88;
  Field local_80;
  uint *local_70;
  TracingServiceState *local_68;
  uint *local_60;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  vector<perfetto::protos::gen::TracingServiceState_TracingSession,_std::allocator<perfetto::protos::gen::TracingServiceState_TracingSession>_>
  *local_48;
  vector<perfetto::protos::gen::TracingServiceState_DataSource,_std::allocator<perfetto::protos::gen::TracingServiceState_DataSource>_>
  *local_40;
  vector<perfetto::protos::gen::TracingServiceState_Producer,_std::allocator<perfetto::protos::gen::TracingServiceState_Producer>_>
  *local_38;
  
  pTVar2 = (this->producers_).
           super__Vector_base<perfetto::protos::gen::TracingServiceState_Producer,_std::allocator<perfetto::protos::gen::TracingServiceState_Producer>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar3 = (this->producers_).
           super__Vector_base<perfetto::protos::gen::TracingServiceState_Producer,_std::allocator<perfetto::protos::gen::TracingServiceState_Producer>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar14 = (uint *)size;
  pTVar22 = pTVar2;
  if (pTVar3 != pTVar2) {
    do {
      (**(pTVar22->super_CppMessageObj)._vptr_CppMessageObj)(pTVar22);
      pTVar22 = pTVar22 + 1;
    } while (pTVar22 != pTVar3);
    (this->producers_).
    super__Vector_base<perfetto::protos::gen::TracingServiceState_Producer,_std::allocator<perfetto::protos::gen::TracingServiceState_Producer>_>
    ._M_impl.super__Vector_impl_data._M_finish = pTVar2;
    puVar14 = extraout_RDX;
  }
  pTVar4 = (this->data_sources_).
           super__Vector_base<perfetto::protos::gen::TracingServiceState_DataSource,_std::allocator<perfetto::protos::gen::TracingServiceState_DataSource>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar5 = (this->data_sources_).
           super__Vector_base<perfetto::protos::gen::TracingServiceState_DataSource,_std::allocator<perfetto::protos::gen::TracingServiceState_DataSource>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pTVar23 = pTVar4;
  if (pTVar5 != pTVar4) {
    do {
      (**(pTVar23->super_CppMessageObj)._vptr_CppMessageObj)(pTVar23);
      pTVar23 = pTVar23 + 1;
    } while (pTVar23 != pTVar5);
    (this->data_sources_).
    super__Vector_base<perfetto::protos::gen::TracingServiceState_DataSource,_std::allocator<perfetto::protos::gen::TracingServiceState_DataSource>_>
    ._M_impl.super__Vector_impl_data._M_finish = pTVar4;
    puVar14 = extraout_RDX_00;
  }
  pTVar6 = (this->tracing_sessions_).
           super__Vector_base<perfetto::protos::gen::TracingServiceState_TracingSession,_std::allocator<perfetto::protos::gen::TracingServiceState_TracingSession>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar7 = (this->tracing_sessions_).
           super__Vector_base<perfetto::protos::gen::TracingServiceState_TracingSession,_std::allocator<perfetto::protos::gen::TracingServiceState_TracingSession>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pTVar24 = pTVar6;
  if (pTVar7 != pTVar6) {
    do {
      (**(pTVar24->super_CppMessageObj)._vptr_CppMessageObj)(pTVar24);
      pTVar24 = pTVar24 + 1;
    } while (pTVar24 != pTVar7);
    (this->tracing_sessions_).
    super__Vector_base<perfetto::protos::gen::TracingServiceState_TracingSession,_std::allocator<perfetto::protos::gen::TracingServiceState_TracingSession>_>
    ._M_impl.super__Vector_impl_data._M_finish = pTVar6;
    puVar14 = extraout_RDX_01;
  }
  local_38 = &this->producers_;
  local_40 = &this->data_sources_;
  local_48 = &this->tracing_sessions_;
  local_50 = &this->unknown_fields_;
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar25 = (uint *)(size + (long)raw);
  do {
    lVar13 = 7;
    if (puVar25 <= raw) goto LAB_002350e6;
    uVar17 = (ulong)(char)(byte)*raw;
    puVar26 = (uint *)((long)raw + 1);
    if ((long)uVar17 < 0) {
      bVar1 = (byte)*raw;
      uVar11 = (ulong)(bVar1 & 0x7f);
      bVar15 = false;
      puVar18 = puVar26;
      for (lVar12 = lVar13;
          (puVar20 = puVar18, uVar17 = uVar11, (char)bVar1 < '\0' &&
          (bVar27 = 0x38 < lVar12 - 7U, bVar15 = bVar27 || puVar25 <= puVar18, puVar14 = puVar18,
          puVar20 = puVar26, uVar17 = 0, !bVar27 && puVar25 > puVar18)); lVar12 = lVar12 + 7) {
        bVar1 = (byte)*puVar18;
        puVar18 = (uint *)((long)puVar18 + 1);
        uVar11 = uVar11 | (ulong)(bVar1 & 0x7f) << ((byte)lVar12 & 0x3f);
        puVar14 = puVar18;
      }
      puVar26 = puVar20;
      if (bVar15) {
        puVar26 = (uint *)raw;
        uVar17 = 0;
      }
      if (puVar26 == (uint *)raw) goto LAB_002350e6;
    }
    uVar10 = (uint)(uVar17 >> 3);
    if ((uVar10 == 0) || (puVar25 <= puVar26)) {
switchD_00234f60_caseD_3:
      bVar15 = false;
      uVar17 = 0;
      local_80.int_value_ = (uint64_t)(uint *)0x0;
    }
    else {
      switch((uint)uVar17 & 7) {
      case 0:
        puVar16 = (uint *)0x0;
        bVar15 = puVar26 >= puVar25;
        if (puVar26 < puVar25) {
          puVar14 = (uint *)((long)puVar26 + 1);
          puVar18 = (uint *)(ulong)((byte)*puVar26 & 0x7f);
          puVar20 = puVar18;
          uVar19 = 0;
          if ((char)(byte)*puVar26 < '\0') {
            puVar20 = (uint *)0x0;
            uVar19 = 0;
            lVar13 = 7;
            puVar21 = puVar14;
            do {
              bVar27 = 0x38 < lVar13 - 7U;
              bVar15 = bVar27 || puVar25 <= puVar21;
              if (bVar27 || puVar25 <= puVar21) goto LAB_002350ed;
              uVar8 = *puVar21;
              puVar21 = (uint *)((long)puVar21 + 1);
              puVar18 = (uint *)((ulong)puVar18 |
                                (ulong)((byte)uVar8 & 0x7f) << ((byte)lVar13 & 0x3f));
              lVar13 = lVar13 + 7;
            } while ((char)(byte)uVar8 < '\0');
            puVar20 = (uint *)((ulong)puVar18 & 0xffffffff);
            puVar14 = puVar21;
            uVar19 = (uint)((ulong)puVar18 >> 0x20);
          }
        }
        else {
          puVar20 = (uint *)0x0;
          uVar19 = 0;
        }
LAB_002350ed:
        puVar18 = (uint *)(ulong)uVar19;
        if (bVar15) {
          puVar14 = puVar26;
          puVar18 = puVar16;
          puVar20 = puVar16;
        }
        local_88 = puVar26;
        local_60 = (uint *)raw;
        if (puVar14 != puVar26) goto LAB_00235114;
        uVar17 = 0;
        bVar15 = false;
        local_80.int_value_ = (uint64_t)puVar16;
        goto LAB_00235156;
      case 1:
        puVar14 = puVar26 + 2;
        if (puVar25 < puVar14) {
LAB_002350e6:
          uVar17 = 0;
          bVar15 = false;
          local_80.int_value_ = (uint64_t)(uint *)0x0;
          goto LAB_00235156;
        }
        puVar20 = *(uint **)puVar26;
        puVar18 = (uint *)((ulong)puVar20 >> 0x20);
        break;
      case 2:
        bVar15 = puVar26 >= puVar25;
        puVar18 = local_70;
        if (puVar26 < puVar25) {
          bVar1 = (byte)*puVar26;
          puVar16 = (uint *)(ulong)(bVar1 & 0x7f);
          puVar20 = (uint *)((long)puVar26 + 1U);
          for (; (puVar14 = puVar20, puVar18 = puVar16, (char)bVar1 < '\0' &&
                 (bVar27 = 0x38 < lVar13 - 7U, bVar15 = bVar27 || puVar25 <= puVar20,
                 puVar14 = (uint *)((long)puVar26 + 1U), puVar18 = local_70,
                 !bVar27 && puVar25 > puVar20)); lVar13 = lVar13 + 7) {
            bVar1 = (byte)*puVar20;
            puVar20 = (uint *)((long)puVar20 + 1);
            puVar16 = (uint *)((ulong)puVar16 | (ulong)(bVar1 & 0x7f) << ((byte)lVar13 & 0x3f));
          }
        }
        local_70 = puVar18;
        if (bVar15) {
          puVar14 = puVar26;
          local_70 = (uint *)0x0;
        }
        if ((puVar14 == puVar26) || ((uint *)((long)puVar25 - (long)puVar14) < local_70)) {
          puVar18 = (uint *)0x0;
          puVar20 = (uint *)0x0;
          bVar15 = false;
          puVar16 = (uint *)0x0;
        }
        else {
          puVar18 = (uint *)((ulong)puVar14 >> 0x20);
          puVar20 = (uint *)((ulong)puVar14 & 0xffffffff);
          puVar14 = (uint *)((long)puVar14 + (long)local_70);
          bVar15 = true;
          puVar16 = local_70;
        }
        local_88 = puVar26;
        if (!bVar15) goto LAB_002350e6;
        goto LAB_00235114;
      default:
        goto switchD_00234f60_caseD_3;
      case 5:
        puVar14 = puVar26 + 1;
        puVar18 = (uint *)0x0;
        if (puVar25 < puVar14) goto LAB_002350e6;
        puVar20 = (uint *)(ulong)*puVar26;
      }
      puVar16 = (uint *)0x0;
LAB_00235114:
      bVar15 = true;
      raw = puVar14;
      if ((uVar10 < 0x10000) && (puVar16 < (uint *)0x10000000)) {
        local_80.int_value_ = (ulong)puVar20 & 0xffffffff | (long)puVar18 << 0x20;
        uVar17 = (ulong)puVar16 | (uVar17 >> 3) << 0x20 | (ulong)((uint)uVar17 & 7) << 0x30;
        bVar15 = false;
      }
      else {
        local_80.int_value_ = 0;
        uVar17 = 0;
      }
    }
LAB_00235156:
    puVar26 = &switchD_00234f60::switchdataD_0034d5b0;
    if (!bVar15) {
      local_80.size_ = (uint32_t)uVar17;
      local_80.type_ = (uint8_t)(uVar17 >> 0x30);
      local_80.id_ = (uint16_t)(uVar17 >> 0x20);
      if (local_80.id_ != 0) {
        local_58 = &this->tracing_service_version_;
        local_68 = this;
        do {
          if ((ushort)(uVar17 >> 0x20) < 8) {
            (this->_has_field_).super__Base_bitset<1UL>._M_w =
                 (this->_has_field_).super__Base_bitset<1UL>._M_w |
                 1L << ((byte)(uVar17 >> 0x20) & 0x3f);
          }
          uVar10 = ((uint)(uVar17 >> 0x20) & 0xffff) - 1;
          if (uVar10 < 7) {
            uVar9 = (*(code *)(&DAT_0034d5c8 + *(int *)(&DAT_0034d5c8 + (ulong)uVar10 * 4)))();
            return (bool)uVar9;
          }
          protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>(&local_80,local_50);
          do {
            if (puVar25 <= raw) goto LAB_002355de;
            uVar17 = (ulong)(char)(byte)*raw;
            puVar14 = (uint *)((long)raw + 1);
            if ((long)uVar17 < 0) {
              uVar11 = (ulong)((byte)*raw & 0x7f);
              bVar15 = false;
              uVar17 = uVar11;
              puVar18 = puVar14;
              if ((char)(byte)*raw < '\0') {
                lVar13 = 7;
                puVar20 = puVar14;
                do {
                  bVar15 = 0x38 < lVar13 - 7U || puVar25 <= puVar20;
                  uVar17 = 0;
                  puVar18 = puVar14;
                  if (bVar15) break;
                  uVar10 = *puVar20;
                  puVar18 = (uint *)((long)puVar20 + 1);
                  uVar11 = uVar11 | (ulong)((byte)uVar10 & 0x7f) << ((byte)lVar13 & 0x3f);
                  lVar13 = lVar13 + 7;
                  uVar17 = uVar11;
                  puVar20 = puVar18;
                } while ((char)(byte)uVar10 < '\0');
              }
              puVar14 = puVar18;
              if (bVar15) {
                puVar14 = (uint *)raw;
                uVar17 = 0;
              }
              if (puVar14 == (uint *)raw) goto LAB_002355de;
            }
            uVar10 = (uint)(uVar17 >> 3);
            if ((uVar10 == 0) || (puVar25 <= puVar14)) {
switchD_00235430_caseD_3:
              bVar15 = false;
              uVar17 = 0;
              local_80.int_value_ = (uint64_t)(uint *)0x0;
            }
            else {
              switch((uint)uVar17 & 7) {
              case 0:
                puVar16 = (uint *)0x0;
                bVar15 = puVar14 >= puVar25;
                if (puVar14 < puVar25) {
                  puVar18 = (uint *)((long)puVar14 + 1);
                  uVar19 = (byte)*puVar14 & 0x7f;
                  uVar11 = (ulong)uVar19;
                  puVar20 = (uint *)(ulong)uVar19;
                  puVar26 = puVar18;
                  uVar19 = 0;
                  if ((char)(byte)*puVar14 < '\0') {
                    puVar20 = (uint *)0x0;
                    lVar13 = 7;
                    puVar21 = puVar18;
                    do {
                      bVar27 = 0x38 < lVar13 - 7U;
                      bVar15 = bVar27 || puVar25 <= puVar21;
                      puVar26 = puVar18;
                      uVar19 = 0;
                      if (bVar27 || puVar25 <= puVar21) break;
                      bVar1 = (byte)*puVar21;
                      puVar21 = (uint *)((long)puVar21 + 1);
                      uVar11 = uVar11 | (ulong)(bVar1 & 0x7f) << ((byte)lVar13 & 0x3f);
                      lVar13 = lVar13 + 7;
                      if (-1 < (char)bVar1) {
                        puVar20 = (uint *)(uVar11 & 0xffffffff);
                      }
                      puVar26 = puVar21;
                      uVar19 = (uint)(uVar11 >> 0x20);
                    } while (-1 >= (char)bVar1);
                  }
                }
                else {
                  puVar20 = (uint *)0x0;
                  uVar19 = 0;
                }
                if (bVar15) {
                  puVar20 = puVar16;
                }
                puVar18 = (uint *)(ulong)uVar19;
                if (bVar15) {
                  puVar26 = puVar14;
                  puVar18 = puVar16;
                }
                this = local_68;
                local_70 = puVar14;
                local_60 = (uint *)raw;
                if (puVar26 != puVar14) goto LAB_00235606;
                uVar17 = 0;
                bVar15 = false;
                local_80.int_value_ = (uint64_t)puVar16;
                goto LAB_00235651;
              case 1:
                puVar26 = puVar14 + 2;
                if (puVar25 < puVar26) {
LAB_002355de:
                  uVar17 = 0;
                  bVar15 = false;
                  local_80.int_value_ = (uint64_t)(uint *)0x0;
                  goto LAB_00235651;
                }
                puVar20 = *(uint **)puVar14;
                puVar18 = (uint *)((ulong)puVar20 >> 0x20);
                break;
              case 2:
                bVar15 = puVar14 >= puVar25;
                puVar18 = local_88;
                if (puVar14 < puVar25) {
                  puVar20 = (uint *)((long)puVar14 + 1);
                  puVar16 = (uint *)(ulong)((byte)*puVar14 & 0x7f);
                  puVar26 = puVar20;
                  puVar18 = puVar16;
                  if ((char)(byte)*puVar14 < '\0') {
                    lVar13 = 7;
                    puVar21 = puVar20;
                    do {
                      bVar15 = 0x38 < lVar13 - 7U || puVar25 <= puVar21;
                      puVar26 = puVar20;
                      puVar18 = local_88;
                      if (bVar15) break;
                      uVar19 = *puVar21;
                      puVar21 = (uint *)((long)puVar21 + 1);
                      puVar16 = (uint *)((ulong)puVar16 |
                                        (ulong)((byte)uVar19 & 0x7f) << ((byte)lVar13 & 0x3f));
                      lVar13 = lVar13 + 7;
                      puVar26 = puVar21;
                      puVar18 = puVar16;
                    } while ((char)(byte)uVar19 < '\0');
                  }
                }
                local_88 = puVar18;
                puVar20 = (uint *)0x0;
                if (bVar15) {
                  puVar26 = puVar14;
                  local_88 = puVar20;
                }
                if (puVar26 == puVar14) {
                  puVar18 = (uint *)0x0;
                  bVar15 = false;
                  puVar16 = (uint *)0x0;
                }
                else if ((uint *)((long)puVar25 - (long)puVar26) < local_88) {
                  puVar20 = (uint *)0x0;
                  puVar18 = (uint *)0x0;
                  bVar15 = false;
                  puVar16 = (uint *)0x0;
                }
                else {
                  puVar18 = (uint *)((ulong)puVar26 >> 0x20);
                  puVar20 = (uint *)((ulong)puVar26 & 0xffffffff);
                  puVar26 = (uint *)((long)puVar26 + (long)local_88);
                  bVar15 = true;
                  puVar16 = local_88;
                }
                this = local_68;
                if (!bVar15) goto LAB_002355de;
                goto LAB_00235606;
              default:
                goto switchD_00235430_caseD_3;
              case 5:
                puVar26 = puVar14 + 1;
                puVar18 = (uint *)0x0;
                if (puVar25 < puVar26) goto LAB_002355de;
                puVar20 = (uint *)(ulong)*puVar14;
              }
              puVar16 = (uint *)0x0;
LAB_00235606:
              raw = puVar26;
              bVar15 = true;
              puVar26 = (uint *)raw;
              if ((uVar10 < 0x10000) && (puVar16 < (uint *)0x10000000)) {
                local_80.int_value_ = (ulong)puVar20 & 0xffffffff | (long)puVar18 << 0x20;
                uVar17 = (ulong)puVar16 | (uVar17 >> 3) << 0x20 | (uVar17 & 7) << 0x30;
                bVar15 = false;
              }
              else {
                local_80.int_value_ = 0;
                uVar17 = 0;
              }
            }
LAB_00235651:
          } while (bVar15);
          local_80.size_ = (uint32_t)uVar17;
          local_80.type_ = (uint8_t)(uVar17 >> 0x30);
          local_80.id_ = (uint16_t)(uVar17 >> 0x20);
        } while (local_80.id_ != 0);
      }
      return puVar25 == (uint *)raw;
    }
  } while( true );
}

Assistant:

bool TracingServiceState::ParseFromArray(const void* raw, size_t size) {
  producers_.clear();
  data_sources_.clear();
  tracing_sessions_.clear();
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* producers */:
        producers_.emplace_back();
        producers_.back().ParseFromArray(field.data(), field.size());
        break;
      case 2 /* data_sources */:
        data_sources_.emplace_back();
        data_sources_.back().ParseFromArray(field.data(), field.size());
        break;
      case 6 /* tracing_sessions */:
        tracing_sessions_.emplace_back();
        tracing_sessions_.back().ParseFromArray(field.data(), field.size());
        break;
      case 7 /* supports_tracing_sessions */:
        field.get(&supports_tracing_sessions_);
        break;
      case 3 /* num_sessions */:
        field.get(&num_sessions_);
        break;
      case 4 /* num_sessions_started */:
        field.get(&num_sessions_started_);
        break;
      case 5 /* tracing_service_version */:
        field.get(&tracing_service_version_);
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}